

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O3

void __thiscall
rangeless::fn::impl::
seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<rangeless::fn::get::second>::gen<rangeless::fn::impl::to_seq::gen<std::map<int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>_>_>_>_>
::seq(seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<rangeless::fn::get::second>::gen<rangeless::fn::impl::to_seq::gen<std::map<int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>_>_>_>_>
      *this,gen<rangeless::fn::impl::transform<rangeless::fn::get::second>::gen<rangeless::fn::impl::to_seq::gen<std::map<int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>_>_>_>
            *gen)

{
  (this->m_current).m_empty = true;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->m_gen).gen.gen.inps._M_t._M_impl.super__Rb_tree_header,
             &(gen->gen).gen.inps._M_t._M_impl.super__Rb_tree_header);
  (this->m_gen).gen.gen.started = (gen->gen).gen.started;
  (this->m_gen).gen.gen.it._M_node = (gen->gen).gen.it._M_node;
  maybe<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>::maybe
            (&(this->m_gen).current_group,&gen->current_group);
  (this->m_gen).it._M_current = (gen->it)._M_current;
  this->m_started = false;
  this->m_ended = false;
  this->m_resumable = false;
  return;
}

Assistant:

seq(Gen gen) 
            : m_gen( std::move(gen) ) // NB: must use parentheses here!
        {}